

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O0

void __thiscall CcsTest_Memory_Test::TestBody(CcsTest_Memory_Test *this)

{
  bool bVar1;
  CcsDomain *this_00;
  string *rhs;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  AssertHelper local_3a0;
  Message local_398 [6];
  exception *e;
  AssertHelper local_360;
  Message local_358;
  allocator local_349;
  string local_348;
  undefined1 local_328 [8];
  AssertionResult gtest_ar;
  TrueWithString gtest_msg;
  string local_2f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d0;
  allocator local_2b1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  allocator local_289;
  string local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  allocator local_249;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  undefined1 local_228 [24];
  CcsContext ctx;
  CcsContext root;
  string local_1f0;
  allocator local_1c9;
  string local_1c8 [32];
  istringstream local_1a8 [8];
  istringstream input;
  CcsDomain *ccs;
  CcsTest_Memory_Test *this_local;
  
  this_00 = (CcsDomain *)operator_new(8);
  ::ccs::CcsDomain::CcsDomain(this_00,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"foo.bar > baz.quux: frob = \'nitz\'",&local_1c9);
  std::__cxx11::istringstream::istringstream(local_1a8,local_1c8,_S_in);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f0,"<literal>",
             (allocator *)
             ((long)&root.searchState.
                     super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  ::ccs::CcsDomain::loadCcsStream
            (this_00,(istream *)local_1a8,&local_1f0,
             (ImportResolver *)&::ccs::(anonymous_namespace)::NoImportResolver);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&root.searchState.
                     super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  ::ccs::CcsDomain::build
            ((CcsDomain *)
             &ctx.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (this_00 != (CcsDomain *)0x0) {
    ::ccs::CcsDomain::~CcsDomain(this_00);
    operator_delete(this_00,8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_248,"foo",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_288,"bar",&local_289);
  anon_unknown.dwarf_25890::v(&local_268,&local_288);
  ::ccs::CcsContext::constrain
            ((CcsContext *)local_228,
             (string *)
             &ctx.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,"baz",&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2f0,"quux",(allocator *)(gtest_msg.value.field_2._M_local_buf + 0xf));
  anon_unknown.dwarf_25890::v(&local_2d0,&local_2f0);
  ::ccs::CcsContext::constrain((CcsContext *)(local_228 + 0x10),(string *)local_228,&local_2b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)(gtest_msg.value.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  ::ccs::CcsContext::~CcsContext((CcsContext *)local_228);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&gtest_ar.message_);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool
                    ((TrueWithString *)&gtest_ar.message_);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_348,"frob",&local_349);
      rhs = ::ccs::CcsContext::getString((CcsContext *)(local_228 + 0x10),&local_348);
      testing::internal::EqHelper::
      Compare<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((EqHelper *)local_328,"\"nitz\"","ctx.getString(\"frob\")",(char (*) [5])"nitz",rhs
                );
      std::__cxx11::string::~string((string *)&local_348);
      std::allocator<char>::~allocator((allocator<char> *)&local_349);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
      if (!bVar1) {
        testing::Message::Message(&local_358);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
        testing::internal::AssertHelper::AssertHelper
                  (&local_360,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
                   ,0x23,pcVar2);
        testing::internal::AssertHelper::operator=(&local_360,&local_358);
        testing::internal::AssertHelper::~AssertHelper(&local_360);
        testing::Message::~Message(&local_358);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
    }
    e._4_4_ = 0;
  }
  else {
    testing::Message::Message(local_398);
    std::operator+(&local_3c0,
                   "Expected: switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal::EqHelper::Compare(\"\\\"nitz\\\"\", \"ctx.getString(\\\"frob\\\")\", \"nitz\", ctx.getString(\"frob\")))) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp\", 35, gtest_ar.failure_message()) = ::testing::Message() doesn\'t throw an exception.\n  Actual: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &gtest_ar.message_);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3a0,local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&local_3c0);
    testing::Message::~Message(local_398);
    e._4_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&gtest_ar.message_);
  if (e._4_4_ == 0) {
    e._4_4_ = 0;
  }
  ::ccs::CcsContext::~CcsContext((CcsContext *)(local_228 + 0x10));
  ::ccs::CcsContext::~CcsContext
            ((CcsContext *)
             &ctx.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::istringstream::~istringstream(local_1a8);
  return;
}

Assistant:

TEST(CcsTest, Memory) {
  CcsDomain *ccs = new CcsDomain();
  std::istringstream input("foo.bar > baz.quux: frob = 'nitz'");
  ccs->loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext root = ccs->build();
  delete ccs;
  CcsContext ctx = root.constrain("foo", v("bar")).constrain("baz", v("quux"));
  ASSERT_NO_THROW(EXPECT_EQ("nitz", ctx.getString("frob")));
}